

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

int str_dump(lua_State *L)

{
  int iVar1;
  undefined1 local_2028 [8];
  luaL_Buffer b;
  lua_State *L_local;
  
  b.buffer._8184_8_ = L;
  luaL_checktype(L,1,6);
  lua_settop((lua_State *)b.buffer._8184_8_,1);
  luaL_buffinit((lua_State *)b.buffer._8184_8_,(luaL_Buffer *)local_2028);
  iVar1 = lua_dump((lua_State *)b.buffer._8184_8_,writer,local_2028);
  if (iVar1 != 0) {
    luaL_error((lua_State *)b.buffer._8184_8_,"unable to dump given function");
  }
  luaL_pushresult((luaL_Buffer *)local_2028);
  return 1;
}

Assistant:

static int str_dump (lua_State *L) {
  luaL_Buffer b;
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 1);
  luaL_buffinit(L,&b);
  if (lua_dump(L, writer, &b) != 0)
    luaL_error(L, "unable to dump given function");
  luaL_pushresult(&b);
  return 1;
}